

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::DataSegmentModuleField::~DataSegmentModuleField(DataSegmentModuleField *this)

{
  ~DataSegmentModuleField(this);
  operator_delete(this);
  return;
}

Assistant:

explicit DataSegmentModuleField(const Location& loc = Location(),
                                  string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::DataSegment>(loc),
        data_segment(name) {}